

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O2

bool Js::CompoundString::TryAppendGeneric<Js::CompoundString::Builder<256u>>
               (char16 *s,CharCount appendCharLength,Builder<256U> *toString)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  CharCount CVar4;
  undefined4 *puVar5;
  char16 *pcVar6;
  
  if (s == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x39e,"(s)","s");
    if (!bVar3) goto LAB_00bc5fd1;
    *puVar5 = 0;
  }
  if (toString == (Builder<256U> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x39f,"(toString)","toString");
    if (!bVar3) goto LAB_00bc5fd1;
    *puVar5 = 0;
  }
  if (toString->isFinalized == true) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3a0,"(!toString->IsFinalized())","!toString->IsFinalized()");
    if (!bVar3) goto LAB_00bc5fd1;
    *puVar5 = 0;
  }
  if (toString->directCharLength != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/CompoundString.h"
                                ,0x3a2,"(toString->HasOnlyDirectChars())",
                                "toString->HasOnlyDirectChars()");
    if (!bVar3) {
LAB_00bc5fd1:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar1 = toString->charLength;
  CVar4 = Block::CharCapacityFromPointerCapacity(0x40);
  if (appendCharLength <= CVar4 - uVar1) {
    pcVar6 = Block::Chars(toString);
    JavascriptString::CopyHelper(pcVar6 + uVar1,s,appendCharLength);
    Builder<256U>::SetLength(toString,toString->stringLength + appendCharLength);
    toString->charLength = appendCharLength + uVar1;
  }
  return appendCharLength <= CVar4 - uVar1;
}

Assistant:

inline bool CompoundString::TryAppendGeneric(
        __in_xcount(appendCharLength) const char16 *const s,
        const CharCount appendCharLength,
        String *const toString)
    {
        Assert(s);
        Assert(toString);
        Assert(!toString->IsFinalized());
        Assert(toString->OwnsLastBlock());
        Assert(toString->HasOnlyDirectChars());

        const CharCount blockCharLength = toString->LastBlockCharLength();
        if(appendCharLength <= toString->LastBlockCharCapacity() - blockCharLength)
        {
            CopyHelper(&toString->LastBlockChars()[blockCharLength], s, appendCharLength);
            toString->SetLength(toString->GetLength() + appendCharLength);
            toString->SetLastBlockCharLength(blockCharLength + appendCharLength);
            return true;
        }
        return false;
    }